

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_std.cc
# Opt level: O2

int main(void)

{
  anon_union_8_1_a8a14541_for_iterator_1 aVar1;
  ostream *poVar2;
  long lVar3;
  allocator_type local_141;
  key_equal local_140;
  hasher local_13f;
  allocator local_13e;
  allocator local_13d;
  allocator local_13c;
  allocator local_13b;
  allocator local_13a;
  allocator local_139;
  flat_hash_set<Person,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
  persons;
  iterator __begin1;
  string local_e8 [32];
  int local_c8;
  string local_c0 [32];
  string local_a0 [32];
  undefined4 local_80;
  string local_78 [32];
  string local_58 [32];
  undefined4 local_38;
  
  std::__cxx11::string::string((string *)&__begin1,"John",&local_139);
  std::__cxx11::string::string(local_e8,"Mitchell",&local_13a);
  local_c8 = 0x23;
  std::__cxx11::string::string(local_c0,"Jane",&local_13b);
  std::__cxx11::string::string(local_a0,"Smith",&local_13c);
  local_80 = 0x20;
  std::__cxx11::string::string(local_78,"Jane",&local_13d);
  std::__cxx11::string::string(local_58,"Smith",&local_13e);
  local_38 = 0x1e;
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,phmap::Hash<Person>,phmap::EqualTo<Person>,std::allocator<Person>>
  ::raw_hash_set<Person_const*>
            ((raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,phmap::Hash<Person>,phmap::EqualTo<Person>,std::allocator<Person>>
              *)&persons,(Person *)&__begin1,(Person *)&stack0xffffffffffffffd0,0,&local_13f,
             &local_140,&local_141);
  lVar3 = 0x90;
  do {
    Person::~Person((Person *)((long)&__begin1.ctrl_ + lVar3));
    lVar3 = lVar3 + -0x48;
  } while (lVar3 != -0x48);
  __begin1 = phmap::priv::
             raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
             ::begin(&persons.
                      super_raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
                    );
  while (__begin1.ctrl_ !=
         persons.
         super_raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
         .ctrl_ + persons.
                  super_raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
                  .capacity_) {
    aVar1 = __begin1.field_1;
    poVar2 = std::operator<<((ostream *)&std::cout,(string *)__begin1.field_1.slot_);
    poVar2 = std::operator<<(poVar2,' ');
    poVar2 = std::operator<<(poVar2,(string *)&(aVar1.slot_)->_last);
    poVar2 = std::operator<<(poVar2," (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(aVar1.slot_)->_age);
    poVar2 = std::operator<<(poVar2,")");
    std::operator<<(poVar2,'\n');
    phmap::priv::
    raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
    ::iterator::operator++(&__begin1);
  }
  phmap::priv::
  raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
  ::~raw_hash_set(&persons.
                   super_raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
                 );
  return 0;
}

Assistant:

int main()
{
    // As we have defined a specialization of std::hash() for Person,
    // we can now create sparse_hash_set or sparse_hash_map of Persons
    // ----------------------------------------------------------------
    phmap::flat_hash_set<Person> persons = 
        { { "John", "Mitchell", 35 },
          { "Jane", "Smith",    32 },
          { "Jane", "Smith",    30 },
        };

    for (auto& p: persons)
        std::cout << p._first << ' ' << p._last << " (" << p._age << ")" << '\n';

}